

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_BFCI(DisasContext_conflict1 *s,arg_BFCI *a)

{
  int iVar1;
  uint ofs;
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar2;
  uint len;
  TCGv_i32 arg1;
  TCGv_i32 tmp2;
  int width;
  int lsb;
  int msb;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_BFCI *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  iVar1 = a->msb;
  ofs = a->lsb;
  iVar2 = arm_dc_feature(s,6);
  if (iVar2 == 0) {
    s_local._7_1_ = false;
  }
  else if (iVar1 < (int)ofs) {
    unallocated_encoding_aarch64(s);
    s_local._7_1_ = true;
  }
  else {
    len = (iVar1 + 1) - ofs;
    if (a->rn == 0xf) {
      _lsb = tcg_const_i32_aarch64(tcg_ctx_00,0);
    }
    else {
      _lsb = load_reg(s,a->rn);
    }
    if (len != 0x20) {
      arg1 = load_reg(s,a->rd);
      tcg_gen_deposit_i32_aarch64(tcg_ctx_00,_lsb,arg1,_lsb,ofs,len);
      tcg_temp_free_i32(tcg_ctx_00,arg1);
    }
    store_reg(s,a->rd,_lsb);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_BFCI(DisasContext *s, arg_BFCI *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;
    int msb = a->msb, lsb = a->lsb;
    int width;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    if (msb < lsb) {
        /* UNPREDICTABLE; we choose to UNDEF */
        unallocated_encoding(s);
        return true;
    }

    width = msb + 1 - lsb;
    if (a->rn == 15) {
        /* BFC */
        tmp = tcg_const_i32(tcg_ctx, 0);
    } else {
        /* BFI */
        tmp = load_reg(s, a->rn);
    }
    if (width != 32) {
        TCGv_i32 tmp2 = load_reg(s, a->rd);
        tcg_gen_deposit_i32(tcg_ctx, tmp, tmp2, tmp, lsb, width);
        tcg_temp_free_i32(tcg_ctx, tmp2);
    }
    store_reg(s, a->rd, tmp);
    return true;
}